

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O2

bool btGeometryUtil::isPointInsidePlanes
               (btAlignedObjectArray<btVector3> *planeEquations,btVector3 *point,btScalar margin)

{
  uint uVar1;
  btVector3 *pbVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  btScalar bVar8;
  
  uVar1 = planeEquations->m_size;
  lVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  uVar4 = 0;
  do {
    uVar5 = uVar4;
    if (uVar7 == uVar5) break;
    pbVar2 = planeEquations->m_data;
    bVar8 = btVector3::dot((btVector3 *)((long)pbVar2->m_floats + lVar6),point);
    lVar3 = lVar6 + 0xc;
    lVar6 = lVar6 + 0x10;
    uVar4 = uVar5 + 1;
  } while (bVar8 + *(float *)((long)pbVar2->m_floats + lVar3) <= margin);
  return (long)(int)uVar1 <= (long)uVar5;
}

Assistant:

bool	btGeometryUtil::isPointInsidePlanes(const btAlignedObjectArray<btVector3>& planeEquations, const btVector3& point, btScalar	margin)
{
	int numbrushes = planeEquations.size();
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		btScalar dist = btScalar(N1.dot(point))+btScalar(N1[3])-margin;
		if (dist>btScalar(0.))
		{
			return false;
		}
	}
	return true;
		
}